

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O2

TestCaseGroup * vkt::image::createImageMultisampleLoadStoreTests(TestContext *testCtx)

{
  VkSampleCountFlagBits samples;
  TestContext *testCtx_00;
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *node;
  long lVar3;
  ImageType imageType;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  char *__rhs;
  undefined8 extraout_RDX_00;
  long lVar5;
  long lVar6;
  allocator<char> local_1e5;
  VkFormat local_1e4;
  int local_1e0;
  int local_1dc;
  TestContext *local_1d8;
  Texture *local_1d0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageViewGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  Args local_188;
  CaseDef caseDef;
  string local_130;
  string samplesCaseName;
  string formatGroupName;
  CaseDef local_cc;
  Texture textures [2];
  CaseDef local_78;
  CaseDef local_54;
  
  local_188.func = (Function)0x2000000020;
  local_188.arg0.texture.m_layerSize.m_data[0] = 1;
  Texture::Texture(textures,IMAGE_TYPE_2D,(IVec3 *)&local_188,1,1);
  local_cc.texture.m_layerSize.m_data[0] = 0x20;
  local_cc.texture.m_layerSize.m_data[1] = 0x20;
  local_cc.texture.m_layerSize.m_data[2] = 1;
  Texture::Texture(textures + 1,IMAGE_TYPE_2D_ARRAY,(IVec3 *)&local_cc,4,1);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_1d8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"load_store_multisample","Multisampled image store and load");
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar2;
  for (lVar6 = 0;
      pTVar2 = testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar6 != 2; lVar6 = lVar6 + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    local_1d0 = textures + lVar6;
    getImageTypeName_abi_cxx11_
              ((string *)&local_188,(image *)(ulong)textures[lVar6].m_type,imageType);
    tcu::TestCaseGroup::TestCaseGroup(pTVar2,local_1d8,(char *)local_188.func,"");
    imageViewGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar2;
    std::__cxx11::string::~string((string *)&local_188);
    local_1e0 = (local_1d0->m_numLayers != 1) + 1;
    uVar4 = extraout_RDX;
    for (lVar3 = 0;
        pTVar2 = imageViewGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar3 != 0xd; lVar3 = lVar3 + 1) {
      local_1e4 = createImageMultisampleLoadStoreTests::formats[lVar3];
      iVar1 = 0;
      while (iVar1 != local_1e0) {
        getFormatShortString_abi_cxx11_
                  ((string *)&local_188,(image *)(ulong)local_1e4,(VkFormat)uVar4);
        __rhs = "";
        if (iVar1 != 0) {
          __rhs = "_single_layer";
        }
        local_1dc = iVar1;
        std::operator+(&formatGroupName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_188,__rhs);
        std::__cxx11::string::~string((string *)&local_188);
        pTVar2 = (TestCaseGroup *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup(pTVar2,local_1d8,formatGroupName._M_dataplus._M_p,"");
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = pTVar2;
        for (lVar5 = 0;
            pTVar2 = formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar5 != 0x18; lVar5 = lVar5 + 4) {
          de::toString<vk::VkSampleCountFlagBits>
                    ((string *)&local_188,
                     (VkSampleCountFlagBits *)
                     ((long)createImageMultisampleLoadStoreTests::samples + lVar5));
          std::operator+(&samplesCaseName,"samples_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_188);
          std::__cxx11::string::~string((string *)&local_188);
          samples = *(VkSampleCountFlagBits *)
                     ((long)createImageMultisampleLoadStoreTests::samples + lVar5);
          Texture::Texture(&caseDef.texture,local_1d0,samples);
          pTVar2 = formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          caseDef.format = local_1e4;
          caseDef.numSamples = samples;
          caseDef.singleLayerBind = iVar1 != 0;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_1e5);
          anon_unknown_1::CaseDef::CaseDef(&local_78,&caseDef);
          testCtx_00 = (pTVar2->super_TestNode).m_testCtx;
          anon_unknown_1::CaseDef::CaseDef(&local_54,&local_78);
          node = (TestNode *)operator_new(0xa8);
          anon_unknown_1::CaseDef::CaseDef(&local_cc,&local_54);
          local_188.func = anon_unknown_1::test;
          anon_unknown_1::CaseDef::CaseDef(&local_188.arg0,&local_cc);
          TestCase::TestCase((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,&samplesCaseName,
                             &local_130);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c06ef0;
          node[1]._vptr_TestNode = (_func_int **)anon_unknown_1::initPrograms;
          FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args::Args
                    ((Args *)&node[1].m_testCtx,&local_188);
          tcu::TestNode::addChild(&pTVar2->super_TestNode,node);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&samplesCaseName);
        }
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(imageViewGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
        std::__cxx11::string::~string((string *)&formatGroupName);
        uVar4 = extraout_RDX_00;
        iVar1 = local_1dc + 1;
      }
    }
    imageViewGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&imageViewGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createImageMultisampleLoadStoreTests (tcu::TestContext& testCtx)
{
	const Texture textures[] =
	{
		// \note Shader code is tweaked to work with image size of 32, take a look if this needs to be modified.
		Texture(IMAGE_TYPE_2D,			tcu::IVec3(32,	32,	1),		1),
		Texture(IMAGE_TYPE_2D_ARRAY,	tcu::IVec3(32,	32,	1),		4),
	};

	static const VkFormat formats[] =
	{
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_SFLOAT,

		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R32_UINT,

		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R32_SINT,

		VK_FORMAT_R8G8B8A8_UNORM,

		VK_FORMAT_R8G8B8A8_SNORM,
	};

	static const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};

	MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "load_store_multisample", "Multisampled image store and load"));

	for (int baseTextureNdx = 0; baseTextureNdx < DE_LENGTH_OF_ARRAY(textures); ++baseTextureNdx)
	{
		const Texture&				baseTexture			= textures[baseTextureNdx];
		MovePtr<tcu::TestCaseGroup>	imageViewGroup		(new tcu::TestCaseGroup(testCtx, getImageTypeName(baseTexture.type()).c_str(), ""));
		const int					numLayerBindModes	= (baseTexture.numLayers() == 1 ? 1 : 2);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		for (int layerBindMode = 0; layerBindMode < numLayerBindModes; ++layerBindMode)
		{
			const bool					singleLayerBind	= (layerBindMode != 0);
			const std::string			formatGroupName	= getFormatShortString(formats[formatNdx]) + (singleLayerBind ? "_single_layer" : "");
			MovePtr<tcu::TestCaseGroup>	formatGroup		(new tcu::TestCaseGroup(testCtx, formatGroupName.c_str(), ""));

			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				const std::string	samplesCaseName = "samples_" + de::toString(samples[samplesNdx]);

				const CaseDef		caseDef =
				{
					Texture(baseTexture, samples[samplesNdx]),
					formats[formatNdx],
					samples[samplesNdx],
					singleLayerBind,
				};

				addFunctionCaseWithPrograms(formatGroup.get(), samplesCaseName, "", initPrograms, test, caseDef);
			}
			imageViewGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageViewGroup.release());
	}

	return testGroup.release();
}